

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-exceptions.hpp
# Opt level: O2

void __thiscall helics::InvalidConversion::~InvalidConversion(InvalidConversion *this)

{
  HelicsException::~HelicsException(&this->super_HelicsException);
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit InvalidConversion(
        std::string_view message = "unable to perform the requested conversion") noexcept:
        HelicsException(message)
    {
    }